

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O3

bool Cipher::normalizeSimilarityMap
               (TParameters *param_1,TSimilarityMap *ccMap,TSimilarityMap *logMap,
               TSimilarityMap *logMapInv)

{
  pointer pvVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  int i_2;
  int i_1;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pvVar1 = (ccMap->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (int)((long)(ccMap->
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) * -0x55555555
  ;
  if ((int)uVar3 < 2) {
    dVar10 = 1e-06;
    dVar12 = 1.79769313486232e+308;
  }
  else {
    dVar12 = 1.79769313486232e+308;
    dVar10 = 2.2250738585072014e-308;
    uVar4 = 1;
    lVar6 = 0x10;
    uVar9 = 0;
    do {
      uVar7 = uVar9 + 1;
      pdVar8 = (double *)
               (*(long *)&pvVar1[uVar9].super__Vector_base<stMatch,_std::allocator<stMatch>_>.
                          _M_impl.super__Vector_impl_data + lVar6);
      uVar9 = (ulong)(uVar3 & 0x7fffffff);
      dVar11 = dVar10;
      dVar13 = dVar12;
      do {
        dVar10 = *pdVar8;
        dVar12 = dVar10;
        if (dVar13 <= dVar10) {
          dVar12 = dVar13;
        }
        if (dVar10 <= dVar11) {
          dVar10 = dVar11;
        }
        pdVar8 = pdVar8 + 2;
        uVar9 = uVar9 - 1;
        dVar11 = dVar10;
        dVar13 = dVar12;
      } while (uVar4 != uVar9);
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x10;
      uVar9 = uVar7;
    } while (uVar7 != uVar3 - 1);
    dVar12 = dVar12 + -1e-06;
    dVar10 = dVar10 + 1e-06;
  }
  printf("ccMax = %g, ccMin = %g\n");
  if ((int)uVar3 < 1) {
    std::
    vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
    ::operator=(logMap,ccMap);
  }
  else {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    uVar9 = 0;
    do {
      pdVar8 = *(double **)
                &(ccMap->
                 super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                 super__Vector_impl_data;
      pdVar5 = pdVar8 + uVar9 * 2;
      uVar7 = 0;
      do {
        if (uVar9 == uVar7) {
          *pdVar5 = 1.0;
        }
        else {
          *pdVar8 = (*pdVar8 - dVar12) / (dVar10 - dVar12);
        }
        uVar7 = uVar7 + 1;
        pdVar8 = pdVar8 + 2;
      } while (uVar4 != uVar7);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar4);
    std::
    vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
    ::operator=(logMap,ccMap);
    if (0 < (int)uVar3) {
      uVar9 = 0;
      do {
        lVar6 = 0;
        uVar7 = 0;
        do {
          lVar2 = *(long *)&(logMap->
                            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar9].
                            super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                            super__Vector_impl_data;
          if (uVar9 == uVar7) {
            *(undefined8 *)(lVar2 + uVar9 * 0x10) = 0;
          }
          else {
            dVar10 = log(*(double *)(lVar2 + lVar6));
            *(double *)(lVar2 + lVar6) = dVar10;
          }
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + 0x10;
        } while (uVar4 != uVar7);
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uVar3 & 0x7fffffff));
      std::
      vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ::operator=(logMapInv,ccMap);
      if ((int)uVar3 < 1) {
        return true;
      }
      uVar9 = 0;
      do {
        lVar6 = 0;
        uVar4 = 0;
        do {
          if (uVar9 == uVar4) {
            *(undefined8 *)
             (*(long *)&(logMap->
                        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar9].
                        super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                        super__Vector_impl_data + uVar9 * 0x10) = 0xc12e848000000000;
          }
          else {
            lVar2 = *(long *)&(logMapInv->
                              super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar9].
                              super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                              super__Vector_impl_data;
            dVar10 = log(1.0 - *(double *)(lVar2 + lVar6));
            *(double *)(lVar2 + lVar6) = dVar10;
          }
          uVar4 = uVar4 + 1;
          lVar6 = lVar6 + 0x10;
        } while ((uVar3 & 0x7fffffff) != uVar4);
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uVar3 & 0x7fffffff));
      return true;
    }
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMapInv,ccMap);
  return true;
}

Assistant:

bool normalizeSimilarityMap(
            const TParameters & ,
            TSimilarityMap & ccMap,
            TSimilarityMap & logMap,
            TSimilarityMap & logMapInv) {
        int n = ccMap.size();

        double ccMin = std::numeric_limits<double>::max();
        double ccMax = std::numeric_limits<double>::min();

        for (int j = 0; j < n - 1; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccMin = std::min(ccMin, ccMap[j][i].cc);
                ccMax = std::max(ccMax, ccMap[j][i].cc);
            }
        }

        ccMin -= 1e-6;
        ccMax += 1e-6;

        printf("ccMax = %g, ccMin = %g\n", ccMax, ccMin);

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    ccMap[j][i].cc = 1.0;
                    continue;
                }

                auto & v = ccMap[j][i].cc;
                v = (v - ccMin)/(ccMax - ccMin);
                //v = 1.0 - std::exp(-1.1f*v);
            }
        }

        logMap = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = 0.0;
                    continue;
                }

                auto & v = logMap[j][i].cc;
                v = std::log(v);
            }
        }

        logMapInv = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = -1e6;
                    continue;
                }

                auto & v = logMapInv[j][i].cc;
                v = std::log(1.0 - v);
            }
        }

        return true;
    }